

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::osout<char,char[12],char[15]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ptc *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*args) [12],
          char (*args_1) [15])

{
  undefined8 uVar1;
  size_t sVar2;
  Print<char> printer;
  savebuf<char> sbuf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  Print<char> local_278;
  undefined **local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  locale local_1d8 [8];
  undefined8 local_1d0;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [376];
  
  Print<char>::Print(&local_278);
  uVar1 = *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0xe8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_210 = (undefined **)sysconf;
  local_208 = 0;
  uStack_200 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  std::locale::locale(local_1d8);
  local_210 = &PTR__savebuf_001596b0;
  local_1c0 = 0;
  local_1b8 = 0;
  local_1d0 = uVar1;
  local_1c8 = &local_1b8;
  std::ios::rdbuf((streambuf *)(this + *(long *)(*(long *)this + -0x18)));
  sVar2 = strlen((char *)os);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)os,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_278.sep._M_dataplus._M_p,local_278.sep._M_string_length);
  sVar2 = strlen(*args);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,*args,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_278.sep._M_dataplus._M_p,local_278.sep._M_string_length);
  std::__cxx11::stringbuf::str();
  Print<char>::print_backend<std::ostream&,std::__cxx11::string>
            (&local_278,(basic_ostream<char,_std::char_traits<char>_> *)this,&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::ios::rdbuf((streambuf *)(this + *(long *)(*(long *)this + -0x18)));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1c8,local_1c8 + local_1c0);
  local_210 = &PTR__savebuf_001596b0;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  local_210 = (undefined **)sysconf;
  std::locale::~locale(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.pattern._M_dataplus._M_p != &local_278.pattern.field_2) {
    operator_delete(local_278.pattern._M_dataplus._M_p,
                    local_278.pattern.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.sep._M_dataplus._M_p != &local_278.sep.field_2) {
    operator_delete(local_278.sep._M_dataplus._M_p,local_278.sep.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.end._M_dataplus._M_p != &local_278.end.field_2) {
    operator_delete(local_278.end._M_dataplus._M_p,local_278.end.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline const std::basic_string<T> osout( std::basic_ostream<T>& os = select_cout<T>::cout, const Args&... args )
   {
    Print<T> printer;
    std::basic_streambuf<T>* buf = os.rdbuf();
    std::basic_ostringstream<T> str;

    savebuf<T> sbuf( buf );
    os.rdbuf( &sbuf );

    ( ( str << args << printer.getSep() ), ... );
    printer( os, str.str() );
    os.rdbuf( buf );
    return sbuf.str();
   }